

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall
ddd::DaTrie<false,_false,_false>::push_block_
          (DaTrie<false,_false,_false> *this,uint32_t block_pos,
          vector<ddd::Block,_std::allocator<ddd::Block>_> *blocks)

{
  int iVar1;
  int in_ESI;
  long in_RDI;
  uint32_t end;
  uint32_t begin;
  uint32_t in_stack_ffffffffffffffc8;
  uint32_t in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  iVar1 = in_ESI * 0x100;
  if (*(int *)(in_RDI + 100) == 0) {
    set_next_((DaTrie<false,_false,_false> *)
              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
              in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    set_prev_((DaTrie<false,_false,_false> *)
              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
              in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    *(int *)(in_RDI + 0x60) = iVar1;
  }
  else {
    prev_((DaTrie<false,_false,_false> *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
          in_stack_ffffffffffffffcc);
    set_prev_((DaTrie<false,_false,_false> *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
              in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    set_next_((DaTrie<false,_false,_false> *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
              in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    prev_((DaTrie<false,_false,_false> *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
          in_stack_ffffffffffffffcc);
    set_next_((DaTrie<false,_false,_false> *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
              in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    set_prev_((DaTrie<false,_false,_false> *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
              in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void push_block_(uint32_t block_pos, std::vector<Block>& blocks) {
    auto begin = block_pos * BLOCK_SIZE;
    auto end = begin + BLOCK_SIZE;

    if (bc_emps_ != 0) {
      set_prev_(begin, prev_(head_pos_));
      set_next_(end - 1, head_pos_);
      set_next_(prev_(head_pos_), begin);
      set_prev_(head_pos_, end - 1);
    } else {
      set_next_(end - 1, begin);
      set_prev_(begin, end - 1);
      head_pos_ = begin;
    }
  }